

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lookup.c
# Opt level: O2

parasail_matrix_t * parasail_matrix_lookup(char *matrixname)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  int index;
  long lVar3;
  
  if (matrixname != (char *)0x0) {
    ppVar2 = &parasail_blosum100;
    for (lVar3 = 1; lVar3 != 0x45; lVar3 = lVar3 + 1) {
      iVar1 = strcmp(matrixname,ppVar2->name);
      if (iVar1 == 0) {
        return ppVar2;
      }
      ppVar2 = parasail_matrices[lVar3];
    }
  }
  return (parasail_matrix_t *)0x0;
}

Assistant:

const parasail_matrix_t* parasail_matrix_lookup(const char *matrixname)
{
    const parasail_matrix_t *matrix = NULL;

    if (matrixname) {
        int index = 0;
        const parasail_matrix_t *current = parasail_matrices[index++];
        while (current) {
            if (0 == strcmp(matrixname, current->name)) {
                matrix = current;
                break;
            }
            current = parasail_matrices[index++];
        }
    }

    return matrix;
}